

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O0

err_t Open(filestream *p,tchar_t *URL,int Flags)

{
  int iVar1;
  uint local_bc;
  undefined1 local_b8 [4];
  int mode;
  stat file_stats;
  int Flags_local;
  tchar_t *URL_local;
  filestream *p_local;
  
  file_stats.__glibc_reserved[2]._4_4_ = Flags;
  if (p->fd != -1) {
    close(p->fd);
  }
  p->Length = -1;
  p->fd = -1;
  if ((URL != (tchar_t *)0x0) && (*URL != '\0')) {
    if (((file_stats.__glibc_reserved[2]._4_4_ & 2) == 0) ||
       ((file_stats.__glibc_reserved[2]._4_4_ & 1) != 0)) {
      if (((file_stats.__glibc_reserved[2]._4_4_ & 1) == 0) ||
         ((file_stats.__glibc_reserved[2]._4_4_ & 2) != 0)) {
        local_bc = 2;
      }
      else {
        local_bc = 0;
      }
    }
    else {
      local_bc = 1;
    }
    if ((file_stats.__glibc_reserved[2]._4_4_ & 4) != 0) {
      local_bc = local_bc | 0x240;
    }
    iVar1 = open64(URL,local_bc,0x1a4);
    p->fd = iVar1;
    if (p->fd == -1) {
      if ((file_stats.__glibc_reserved[2]._4_4_ & 0x28) == 0) {
        NodeReportError(p,(node *)0x0,0x5f525245,-8,URL);
      }
      return -8;
    }
    tcscpy_s(p->URL,0x100,URL);
    iVar1 = stat64(URL,(stat64 *)local_b8);
    if (iVar1 == 0) {
      p->Length = file_stats.st_rdev;
    }
  }
  return 0;
}

Assistant:

static err_t Open(filestream* p, const tchar_t* URL, int Flags)
{
    if (p->fd != -1)
        close(p->fd);

    p->Length = INVALID_FILEPOS_T;
    p->fd = -1;

    if (URL && URL[0])
    {
        struct stat file_stats;
        int mode = 0;

        if (Flags & SFLAG_WRONLY && !(Flags & SFLAG_RDONLY))
            mode = O_WRONLY;
        else if (Flags & SFLAG_RDONLY && !(Flags & SFLAG_WRONLY))
            mode = O_RDONLY;
        else
            mode = O_RDWR;

        if (Flags & SFLAG_CREATE)
            mode |= O_CREAT|O_TRUNC;

        //TODO: verify it works with Unicode files too
        p->fd = open(URL, mode, _RW_ACCESS_FILE);
        if (p->fd == -1)
        {
            if ((Flags & (SFLAG_REOPEN|SFLAG_SILENT))==0)
                NodeReportError(p,NULL,ERR_ID,ERR_FILE_NOT_FOUND,URL);
            return ERR_FILE_NOT_FOUND;
        }

        tcscpy_s(p->URL,TSIZEOF(p->URL),URL);

        if (stat(URL, &file_stats) == 0)
            p->Length = file_stats.st_size;

    }
    return ERR_NONE;
}